

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O0

ScriptFunction *
Js::StackScriptFunction::OP_NewStackScFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,ScriptFunction *stackFunction)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar3;
  FunctionInfo *pFVar4;
  FunctionProxy *this;
  undefined4 *puVar5;
  FunctionProxy *pFVar6;
  FunctionBody *pFVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  char16_t *local_a0;
  FunctionProxy *functionProxy;
  char16 debugStringBuffer [42];
  ScriptFunction *stackFunction_local;
  FunctionInfoPtrPtr infoRef_local;
  FrameDisplay *environment_local;
  
  if (stackFunction == (ScriptFunction *)0x0) {
    environment_local = (FrameDisplay *)ScriptFunction::OP_NewScFunc(environment,infoRef);
  }
  else {
    pFVar4 = Memory::WriteBarrierPtr<Js::FunctionInfo>::operator->(infoRef);
    this = FunctionInfo::GetFunctionProxy(pFVar4);
    if (this == (FunctionProxy *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                  ,0x2ec,"(functionProxy != nullptr)",
                                  "BYTE-CODE VERIFY: Must specify a valid function to create");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pFVar4 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)stackFunction);
    pFVar6 = FunctionInfo::GetFunctionProxy(pFVar4);
    if (pFVar6 != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                  ,0x2ed,
                                  "(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy)"
                                  ,
                                  "stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = FunctionProxy::IsFunctionBody(this);
    if (bVar2) {
      pFVar7 = FunctionProxy::GetFunctionBody(this);
      pFVar4 = FunctionBody::GetStackNestedFuncParentStrongRef(pFVar7);
      if (pFVar4 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                    ,0x2ee,
                                    "(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr)"
                                    ,
                                    "!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    ScriptFunction::SetEnvironment(stackFunction,environment);
    sourceContextId = FunctionProxy::GetSourceContextId(this);
    functionId = FunctionProxy::GetLocalFunctionId(this);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StackFuncPhase,sourceContextId,functionId);
    environment_local = (FrameDisplay *)stackFunction;
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      bVar2 = FunctionProxy::IsFunctionBody(this);
      if (bVar2) {
        pFVar7 = FunctionProxy::GetFunctionBody(this);
        iVar3 = (*(pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
        local_a0 = (char16_t *)CONCAT44(extraout_var,iVar3);
      }
      else {
        local_a0 = L"<deferred>";
      }
      pcVar8 = FunctionProxy::GetDebugNumberSet(this,(wchar (*) [42])&functionProxy);
      Output::Print(L"Stack alloc nested function: %s %s (address: %p)\n",local_a0,pcVar8,
                    stackFunction);
      Output::Flush();
    }
  }
  return (ScriptFunction *)environment_local;
}

Assistant:

ScriptFunction * StackScriptFunction::OP_NewStackScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, ScriptFunction * stackFunction)
    {
        if (stackFunction)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

            FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
            AssertMsg(functionProxy != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
            Assert(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy);
            Assert(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr);
            stackFunction->SetEnvironment(environment);


            PHASE_PRINT_VERBOSE_TRACE(Js::StackFuncPhase, functionProxy,
                _u("Stack alloc nested function: %s %s (address: %p)\n"),
                    functionProxy->IsFunctionBody()?
                        functionProxy->GetFunctionBody()->GetDisplayName() : _u("<deferred>"),
                        functionProxy->GetDebugNumberSet(debugStringBuffer), stackFunction);
            return stackFunction;
        }
        return ScriptFunction::OP_NewScFunc(environment, infoRef);
    }